

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O3

char * duckdb::NumericHelper::FormatUnsigned<unsigned_short>(unsigned_short value,char *ptr)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar5 = (ulong)value;
  if (value < 100) {
    uVar4 = (uint)value;
  }
  else {
    do {
      uVar6 = (uint)uVar5;
      uVar4 = (uint)(uVar5 >> 2) / 0x19;
      uVar2 = NumericCastImpl<unsigned_int,_int,_false>::Convert
                        ((uVar6 + uVar4 * -100) * 2 & 0xffff);
      ptr[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2 + 1];
      ptr[-2] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2];
      ptr = ptr + -2;
      uVar5 = (ulong)uVar4;
    } while (9999 < uVar6);
  }
  if ((ushort)uVar4 < 10) {
    cVar1 = NumericCastImpl<char,_int,_false>::Convert(uVar4 | 0x30);
    lVar3 = -1;
  }
  else {
    uVar4 = NumericCastImpl<unsigned_int,_int,_false>::Convert(uVar4 * 2);
    ptr[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar4 + 1];
    cVar1 = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar4];
    lVar3 = -2;
  }
  ptr[lVar3] = cVar1;
  return ptr + lVar3;
}

Assistant:

static char *FormatUnsigned(T value, char *ptr) {
		while (value >= 100) {
			// Integer division is slow so do it for a group of two digits instead
			// of for every digit. The idea comes from the talk by Alexandrescu
			// "Three Optimization Tips for C++".
			auto index = NumericCast<unsigned>((value % 100) * 2);
			value /= 100;
			*--ptr = duckdb_fmt::internal::data::digits[index + 1];
			*--ptr = duckdb_fmt::internal::data::digits[index];
		}
		if (value < 10) {
			*--ptr = NumericCast<char>('0' + value);
			return ptr;
		}
		auto index = NumericCast<unsigned>(value * 2);
		*--ptr = duckdb_fmt::internal::data::digits[index + 1];
		*--ptr = duckdb_fmt::internal::data::digits[index];
		return ptr;
	}